

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_traits.h
# Opt level: O2

void lzham::helpers::construct_array<lzham::adaptive_bit_model>(adaptive_bit_model *p,uint n)

{
  long lVar1;
  
  for (lVar1 = (ulong)n * 2; lVar1 != 0; lVar1 = lVar1 + -2) {
    adaptive_bit_model::adaptive_bit_model(p);
    p = p + 1;
  }
  return;
}

Assistant:

inline void construct_array(T* p, uint n)
      {
         if (LZHAM_IS_SCALAR_TYPE(T))
         {
            memset(p, 0, sizeof(T) * n);
         }
         else
         {
            T* q = p + n;
            for ( ; p != q; ++p)
               new (static_cast<void*>(p)) T;
         }
      }